

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Test.cpp
# Opt level: O2

EStatusCode SaveCharstringCode(char **argv,string *inCharStringName,Type1Input *inType1Input)

{
  EStatusCode EVar1;
  IByteWriter *inWriter;
  CharStringType1Tracer tracer;
  OutputFile glyphFile;
  allocator<char> local_112;
  allocator<char> local_111;
  CharStringType1Tracer local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  OutputFile local_70;
  string local_40;
  
  OutputFile::OutputFile(&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"glyphType1_",&local_112);
  std::operator+(&local_d0,&local_f0,inCharStringName);
  std::operator+(&local_b0,&local_d0,"_.txt");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,argv[2],&local_111);
  LocalPathToFileURL((FileURL *)&local_110,&local_40);
  RelativeURLToLocalPath(&local_90,(FileURL *)&local_110,&local_b0);
  FileURL::~FileURL((FileURL *)&local_110);
  std::__cxx11::string::~string((string *)&local_40);
  EVar1 = OutputFile::OpenFile(&local_70,&local_90,false);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  if (EVar1 == eSuccess) {
    CharStringType1Tracer::CharStringType1Tracer(&local_110);
    inWriter = &OutputFile::GetOutputStream(&local_70)->super_IByteWriter;
    EVar1 = CharStringType1Tracer::TraceGlyphProgram
                      (&local_110,inCharStringName,inType1Input,inWriter);
    CharStringType1Tracer::~CharStringType1Tracer(&local_110);
  }
  OutputFile::CloseFile(&local_70);
  OutputFile::~OutputFile(&local_70);
  return EVar1;
}

Assistant:

static EStatusCode SaveCharstringCode(char* argv[],const string& inCharStringName,Type1Input* inType1Input)
{
	OutputFile glyphFile;

    
	EStatusCode status = glyphFile.OpenFile(
                                            BuildRelativeOutputPath(argv,string("glyphType1_") + inCharStringName + "_.txt"));

	do
	{
		if(status != PDFHummus::eSuccess)
			break;
		
		CharStringType1Tracer tracer;

		status = tracer.TraceGlyphProgram(inCharStringName,inType1Input,glyphFile.GetOutputStream());

	}while(false);

	glyphFile.CloseFile();

	return status;

}